

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

string * __thiscall
t_netstd_generator::netstd_thrift_usings_abi_cxx11_
          (string *__return_storage_ptr__,t_netstd_generator *this)

{
  string namespaces;
  allocator local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string
            ((string *)&local_30,
             "using Thrift.Protocol;\nusing Thrift.Protocol.Entities;\nusing Thrift.Protocol.Utilities;\nusing Thrift.Transport;\nusing Thrift.Transport.Client;\nusing Thrift.Transport.Server;\nusing Thrift.Processor;\n"
             ,&local_31);
  std::operator+(__return_storage_ptr__,&local_30,&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string t_netstd_generator::netstd_thrift_usings() const
{
    string namespaces =
        "using Thrift.Protocol;\n"
        "using Thrift.Protocol.Entities;\n"
        "using Thrift.Protocol.Utilities;\n"
        "using Thrift.Transport;\n"
        "using Thrift.Transport.Client;\n"
        "using Thrift.Transport.Server;\n"
        "using Thrift.Processor;\n";

    return namespaces + endl;
}